

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

void vk::BinaryRegistryDetail::anon_unknown_8::addToSparseIndex
               (SparseIndexNode *group,deUint32 *words,size_t numWords,deUint32 index)

{
  ulong uVar1;
  size_type sVar2;
  reference ppSVar3;
  vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
  *pvVar4;
  deUint32 local_7c;
  SparseIndexNode *local_40;
  ulong local_38;
  size_t childNdx;
  SparseIndexNode *child;
  deUint32 curWord;
  deUint32 index_local;
  size_t numWords_local;
  deUint32 *words_local;
  SparseIndexNode *group_local;
  
  child._0_4_ = *words;
  childNdx = 0;
  local_38 = 0;
  child._4_4_ = index;
  _curWord = numWords;
  numWords_local = (size_t)words;
  words_local = &group->word;
  do {
    uVar1 = local_38;
    sVar2 = std::
            vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
            ::size((vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                    *)(words_local + 2));
    if (sVar2 <= uVar1) {
LAB_01188fb9:
      if (childNdx == 0) {
        pvVar4 = (vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                  *)(words_local + 2);
        sVar2 = std::
                vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                ::size((vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                        *)(words_local + 2));
        std::
        vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
        ::reserve(pvVar4,sVar2 + 1);
        pvVar4 = (vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                  *)(words_local + 2);
        local_40 = (SparseIndexNode *)operator_new(0x20);
        if (_curWord == 1) {
          local_7c = child._4_4_;
        }
        else {
          local_7c = 0;
        }
        SparseIndexNode::SparseIndexNode(local_40,(deUint32)child,local_7c);
        std::
        vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
        ::push_back(pvVar4,&local_40);
        ppSVar3 = std::
                  vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                  ::back((vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                          *)(words_local + 2));
        childNdx = (size_t)*ppSVar3;
      }
      if (1 < _curWord) {
        addToSparseIndex((SparseIndexNode *)childNdx,(deUint32 *)(numWords_local + 4),_curWord - 1,
                         child._4_4_);
      }
      return;
    }
    ppSVar3 = std::
              vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
              ::operator[]((vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                            *)(words_local + 2),local_38);
    if ((*ppSVar3)->word == (deUint32)child) {
      ppSVar3 = std::
                vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                ::operator[]((vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                              *)(words_local + 2),local_38);
      childNdx = (size_t)*ppSVar3;
      goto LAB_01188fb9;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void addToSparseIndex (SparseIndexNode* group, const deUint32* words, size_t numWords, deUint32 index)
{
	const deUint32		curWord	= words[0];
	SparseIndexNode*	child	= DE_NULL;

	for (size_t childNdx = 0; childNdx < group->children.size(); childNdx++)
	{
		if (group->children[childNdx]->word == curWord)
		{
			child = group->children[childNdx];
			break;
		}
	}

	DE_ASSERT(numWords > 1 || !child);

	if (!child)
	{
		group->children.reserve(group->children.size()+1);
		group->children.push_back(new SparseIndexNode(curWord, numWords == 1 ? index : 0));

		child = group->children.back();
	}

	if (numWords > 1)
		addToSparseIndex(child, words+1, numWords-1, index);
	else
		DE_ASSERT(isNullByteTerminated(curWord));
}